

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::BringWindowToDisplayBack(ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  ImGuiWindow **ppIVar2;
  ImGuiWindow **__src;
  ImGuiWindow *in_RDI;
  int i;
  ImGuiContext *g;
  undefined8 in_stack_ffffffffffffffd8;
  int iVar3;
  ImVector<ImGuiWindow_*> *in_stack_ffffffffffffffe0;
  int local_14;
  
  pIVar1 = GImGui;
  iVar3 = (int)((ulong)in_stack_ffffffffffffffd8 >> 0x20);
  ppIVar2 = ImVector<ImGuiWindow_*>::operator[](in_stack_ffffffffffffffe0,iVar3);
  if (*ppIVar2 != in_RDI) {
    for (local_14 = 0; local_14 < (pIVar1->Windows).Size; local_14 = local_14 + 1) {
      ppIVar2 = ImVector<ImGuiWindow_*>::operator[](in_stack_ffffffffffffffe0,iVar3);
      if (*ppIVar2 == in_RDI) {
        ppIVar2 = ImVector<ImGuiWindow_*>::operator[](in_stack_ffffffffffffffe0,iVar3);
        iVar3 = (int)((ulong)ppIVar2 >> 0x20);
        __src = ImVector<ImGuiWindow_*>::operator[](in_stack_ffffffffffffffe0,iVar3);
        memmove(ppIVar2,__src,(long)local_14 << 3);
        ppIVar2 = ImVector<ImGuiWindow_*>::operator[]((ImVector<ImGuiWindow_*> *)in_RDI,iVar3);
        *ppIVar2 = in_RDI;
        return;
      }
    }
  }
  return;
}

Assistant:

void ImGui::BringWindowToDisplayBack(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    if (g.Windows[0] == window)
        return;
    for (int i = 0; i < g.Windows.Size; i++)
        if (g.Windows[i] == window)
        {
            memmove(&g.Windows[1], &g.Windows[0], (size_t)i * sizeof(ImGuiWindow*));
            g.Windows[0] = window;
            break;
        }
}